

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlRelaxNGValidatePushCData(void)

{
  int iVar1;
  int iVar2;
  int val;
  xmlChar *val_00;
  size_t sVar3;
  uint local_3c;
  int n_len;
  int len;
  int n_data;
  xmlChar *data;
  int n_ctxt;
  xmlRelaxNGValidCtxtPtr ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (data._4_4_ = 0; (int)data._4_4_ < 1; data._4_4_ = data._4_4_ + 1) {
    for (n_len = 0; n_len < 5; n_len = n_len + 1) {
      for (local_3c = 0; (int)local_3c < 4; local_3c = local_3c + 1) {
        iVar1 = xmlMemBlocks();
        val_00 = gen_const_xmlChar_ptr(n_len,1);
        iVar2 = gen_int(local_3c,2);
        if ((val_00 == (xmlChar *)0x0) || (sVar3 = strlen((char *)val_00), iVar2 <= (int)sVar3 + 1))
        {
          val = xmlRelaxNGValidatePushCData(0,val_00,iVar2);
          desret_int(val);
          call_tests = call_tests + 1;
          des_const_xmlChar_ptr(n_len,val_00,1);
          des_int(local_3c,iVar2,2);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlRelaxNGValidatePushCData",
                   (ulong)(uint)(iVar2 - iVar1));
            ret_val = ret_val + 1;
            printf(" %d",(ulong)data._4_4_);
            printf(" %d",(ulong)(uint)n_len);
            printf(" %d",(ulong)local_3c);
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlRelaxNGValidatePushCData(void) {
    int test_ret = 0;

#if defined(LIBXML_SCHEMAS_ENABLED)
    int mem_base;
    int ret_val;
    xmlRelaxNGValidCtxtPtr ctxt; /* the RelaxNG validation context */
    int n_ctxt;
    xmlChar * data; /* some character data read */
    int n_data;
    int len; /* the length of the data */
    int n_len;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlRelaxNGValidCtxtPtr;n_ctxt++) {
    for (n_data = 0;n_data < gen_nb_const_xmlChar_ptr;n_data++) {
    for (n_len = 0;n_len < gen_nb_int;n_len++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlRelaxNGValidCtxtPtr(n_ctxt, 0);
        data = gen_const_xmlChar_ptr(n_data, 1);
        len = gen_int(n_len, 2);
        if ((data != NULL) &&
            (len > (int) strlen((const char *) data) + 1))
            continue;

        ret_val = xmlRelaxNGValidatePushCData(ctxt, (const xmlChar *)data, len);
        desret_int(ret_val);
        call_tests++;
        des_xmlRelaxNGValidCtxtPtr(n_ctxt, ctxt, 0);
        des_const_xmlChar_ptr(n_data, (const xmlChar *)data, 1);
        des_int(n_len, len, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlRelaxNGValidatePushCData",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_data);
            printf(" %d", n_len);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}